

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

UnixUnusedFd * findReusableFd(char *zPath,int flags)

{
  int iVar1;
  bool bVar2;
  UnixUnusedFd **local_c0;
  UnixUnusedFd **pp;
  unixInodeInfo *pInode;
  stat sStat;
  UnixUnusedFd *pUnused;
  int flags_local;
  char *zPath_local;
  
  sStat.__glibc_reserved[2] = 0;
  iVar1 = stat(zPath,(stat *)&pInode);
  if (iVar1 == 0) {
    unixEnterMutex();
    pp = (UnixUnusedFd **)inodeList;
    while( true ) {
      bVar2 = false;
      if ((pp != (UnixUnusedFd **)0x0) && (bVar2 = true, (unixInodeInfo *)*pp == pInode)) {
        bVar2 = pp[1] != (UnixUnusedFd *)sStat.st_dev;
      }
      if (!bVar2) break;
      pp = (UnixUnusedFd **)pp[5];
    }
    if (pp != (UnixUnusedFd **)0x0) {
      local_c0 = pp + 4;
      while( true ) {
        bVar2 = false;
        if (*local_c0 != (UnixUnusedFd *)0x0) {
          bVar2 = (*local_c0)->flags != flags;
        }
        if (!bVar2) break;
        local_c0 = &(*local_c0)->pNext;
      }
      sStat.__glibc_reserved[2] = (__syscall_slong_t)*local_c0;
      if ((UnixUnusedFd *)sStat.__glibc_reserved[2] != (UnixUnusedFd *)0x0) {
        *local_c0 = ((UnixUnusedFd *)sStat.__glibc_reserved[2])->pNext;
      }
    }
    unixLeaveMutex();
  }
  return (UnixUnusedFd *)sStat.__glibc_reserved[2];
}

Assistant:

static UnixUnusedFd *findReusableFd(const char *zPath, int flags){
  UnixUnusedFd *pUnused = 0;
  struct stat sStat;                   /* Results of stat() call */
  /* A stat() call may fail for various reasons. If this happens, it is
  ** almost certain that an open() call on the same path will also fail.
  ** For this reason, if an error occurs in the stat() call here, it is
  ** ignored and -1 is returned. The caller will try to open a new file
  ** descriptor on the same path, fail, and return an error to SQLite.
  **
  ** Even if a subsequent open() call does succeed, the consequences of
  ** not searching for a resusable file descriptor are not dire.  */
  if( 0==stat(zPath, &sStat) ){
    unixInodeInfo *pInode;

    unixEnterMutex();
    pInode = inodeList;
    while( pInode && (pInode->fileId.dev!=sStat.st_dev
                     || pInode->fileId.ino!=sStat.st_ino) ){
       pInode = pInode->pNext;
    }
    if( pInode ){
      UnixUnusedFd **pp;
      for(pp=&pInode->pUnused; *pp && (*pp)->flags!=flags; pp=&((*pp)->pNext));
      pUnused = *pp;
      if( pUnused ){
        *pp = pUnused->pNext;
      }
    }
    unixLeaveMutex();
  }
  return pUnused;
}